

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

bool __thiscall
dg::llvmdg::LazyLLVMCallGraph::calls(LazyLLVMCallGraph *this,Function *F,Function *what)

{
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  p_Var6 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var6->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(Function **)(p_Var5 + 1) < F]) {
    if (*(Function **)(p_Var5 + 1) >= F) {
      p_Var2 = p_Var5;
    }
  }
  p_Var5 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var6) && (p_Var5 = p_Var2, F < *(Function **)(p_Var2 + 1))) {
    p_Var5 = &p_Var6->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var6) {
    _populateCalledFunctions(this,F);
  }
  p_Var6 = &(this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->_cg)._mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = p_Var2;
  p_Var3 = &p_Var6->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(Function **)(p_Var5 + 1) < F]) {
    if (*(Function **)(p_Var5 + 1) >= F) {
      p_Var3 = p_Var5;
    }
  }
  p_Var5 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var6) && (p_Var5 = p_Var3, F < *(Function **)(p_Var3 + 1))) {
    p_Var5 = &p_Var6->_M_header;
  }
  p_Var3 = &p_Var6->_M_header;
  pp_Var4 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    pp_Var4 = &p_Var5[1]._M_parent;
  }
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < what]) {
    if (*(Function **)(p_Var2 + 1) >= what) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var6) && (p_Var2 = p_Var3, what < *(Function **)(p_Var3 + 1)))
  {
    p_Var2 = &p_Var6->_M_header;
  }
  bVar7 = false;
  if (((_Rb_tree_header *)p_Var5 != p_Var6) && (bVar7 = false, (_Rb_tree_header *)p_Var2 != p_Var6))
  {
    p_Var5 = *(_Base_ptr *)((long)pp_Var4 + 0x10);
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::GenericCallGraph<llvm::Function_const*>::FuncNode::_contains<std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>(dg::GenericCallGraph<llvm::Function_const*>::FuncNode_const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>const&)const::_lambda(dg::GenericCallGraph<llvm::Function_const*>::FuncNode*)_1_>>
                      (*(_Base_ptr *)((long)pp_Var4 + 8),p_Var5,&p_Var2[1]._M_parent);
    bVar7 = (_Base_ptr)_Var1._M_current != p_Var5;
  }
  return bVar7;
}

Assistant:

bool calls(const llvm::Function *F, const llvm::Function *what) override {
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fn1 = _cg.get(F);
        auto fn2 = _cg.get(what);
        if (fn1 && fn2) {
            return fn1->calls(fn2);
        }
        return false;
    }